

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O2

PackedColor Imath_2_5::rgb2packed<unsigned_char>(Color4<unsigned_char> *c)

{
  Color4<unsigned_char> CVar1;
  undefined1 auVar2 [13];
  PackedColor PVar3;
  undefined1 auVar4 [16];
  Color4<float> local_18;
  
  CVar1 = *c;
  auVar2[0xc] = CVar1.a;
  auVar2._0_12_ = ZEXT712(0);
  auVar4._0_4_ = (float)((uint)CVar1 & 0xff);
  auVar4._4_4_ = (float)((uint)CVar1 >> 8 & 0xff);
  auVar4._8_4_ = (float)(int)CONCAT32(auVar2._10_3_,(ushort)CVar1.b);
  auVar4._12_4_ = (float)(uint3)(auVar2._10_3_ >> 0x10);
  local_18 = (Color4<float>)divps(auVar4,_DAT_00146e00);
  PVar3 = rgb2packed<float>(&local_18);
  return PVar3;
}

Assistant:

PackedColor
rgb2packed(const Color4<T> &c)
{
    if ( limits<T>::isIntegral() )
    {
	float r = c.r / float(limits<T>::max());
	float g = c.g / float(limits<T>::max());
	float b = c.b / float(limits<T>::max());
	float a = c.a / float(limits<T>::max());
	return rgb2packed( C4f(r,g,b,a) );
    }
    else
    {
	return (  (PackedColor) (c.r * 255)		|
		(((PackedColor) (c.g * 255)) << 8)	|
		(((PackedColor) (c.b * 255)) << 16)	|
		(((PackedColor) (c.a * 255)) << 24));
    }
}